

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O1

void __thiscall
bwtil::IndexedBWT::IndexedBWT(IndexedBWT *this,string *BWT,ulint sample_rate,bool verbose)

{
  pointer pcVar1;
  pointer puVar2;
  pointer puVar3;
  pointer psVar4;
  ulong uVar5;
  pointer puVar6;
  uint uVar7;
  int iVar8;
  ulint uVar9;
  ostream *poVar10;
  pointer puVar11;
  long lVar12;
  pointer __s;
  long lVar13;
  uint64_t uVar14;
  unsigned_long uVar15;
  undefined8 uVar16;
  uchar *puVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  byte bVar21;
  pointer puVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar28 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar29 [16];
  undefined1 in_ZMM2 [64];
  reference rVar30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet;
  vector<bool,_std::allocator<bool>_> mark_pos;
  vector<bool,_std::allocator<bool>_> char_inserted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  uint local_100;
  uint local_fc;
  undefined1 local_f8 [16];
  pointer local_e8;
  uint local_e0;
  _Bit_pointer local_d8;
  undefined1 local_c8 [40];
  pointer puStack_a0;
  pointer local_98;
  undefined1 local_90 [16];
  pointer local_80;
  uint64_t local_78;
  uint16_t local_70;
  vector<bool,_std::allocator<bool>_> local_60;
  ulint local_38;
  
  auVar29 = in_ZMM2._0_16_;
  auVar28 = in_ZMM1._0_16_;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->marked_positions).n = 0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->marked_positions).bitvector.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&(this->marked_positions).global_rank1 + 2) = 0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->text_pointers)._size = 0;
  (this->text_pointers)._width = 0;
  (this->text_pointers)._field_mask = 0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar19 = BWT->_M_string_length;
  this->n = uVar19;
  this->offrate = sample_rate;
  if (sample_rate == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = uVar19 / sample_rate + 1;
  }
  this->number_of_SA_pointers = uVar9;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," Building indexed BWT data structure",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    auVar25._8_56_ = extraout_var_00;
    auVar25._0_8_ = extraout_XMM1_Qa;
    auVar28 = auVar25._0_16_;
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Number of sampled SA pointers = ",0x22);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      auVar23._8_56_ = extraout_var_01;
      auVar23._0_8_ = extraout_XMM1_Qa_00;
      auVar28 = auVar23._0_16_;
    }
  }
  auVar28 = vcvtusi2sd_avx512f(auVar28,this->n);
  auVar24._0_8_ = log2(auVar28._0_8_);
  auVar24._8_56_ = extraout_var;
  auVar28 = vroundsd_avx(auVar24._0_16_,auVar24._0_16_,10);
  iVar8 = vcvttsd2usi_avx512f(auVar28);
  this->w = iVar8 + (uint)(iVar8 == 0);
  puVar11 = (pointer)operator_new(0x100);
  puVar11[0xc0] = '\0';
  puVar11[0xc1] = '\0';
  puVar11[0xc2] = '\0';
  puVar11[0xc3] = '\0';
  puVar11[0xc4] = '\0';
  puVar11[0xc5] = '\0';
  puVar11[0xc6] = '\0';
  puVar11[199] = '\0';
  puVar11[200] = '\0';
  puVar11[0xc9] = '\0';
  puVar11[0xca] = '\0';
  puVar11[0xcb] = '\0';
  puVar11[0xcc] = '\0';
  puVar11[0xcd] = '\0';
  puVar11[0xce] = '\0';
  puVar11[0xcf] = '\0';
  puVar11[0xd0] = '\0';
  puVar11[0xd1] = '\0';
  puVar11[0xd2] = '\0';
  puVar11[0xd3] = '\0';
  puVar11[0xd4] = '\0';
  puVar11[0xd5] = '\0';
  puVar11[0xd6] = '\0';
  puVar11[0xd7] = '\0';
  puVar11[0xd8] = '\0';
  puVar11[0xd9] = '\0';
  puVar11[0xda] = '\0';
  puVar11[0xdb] = '\0';
  puVar11[0xdc] = '\0';
  puVar11[0xdd] = '\0';
  puVar11[0xde] = '\0';
  puVar11[0xdf] = '\0';
  puVar11[0xe0] = '\0';
  puVar11[0xe1] = '\0';
  puVar11[0xe2] = '\0';
  puVar11[0xe3] = '\0';
  puVar11[0xe4] = '\0';
  puVar11[0xe5] = '\0';
  puVar11[0xe6] = '\0';
  puVar11[0xe7] = '\0';
  puVar11[0xe8] = '\0';
  puVar11[0xe9] = '\0';
  puVar11[0xea] = '\0';
  puVar11[0xeb] = '\0';
  puVar11[0xec] = '\0';
  puVar11[0xed] = '\0';
  puVar11[0xee] = '\0';
  puVar11[0xef] = '\0';
  puVar11[0xf0] = '\0';
  puVar11[0xf1] = '\0';
  puVar11[0xf2] = '\0';
  puVar11[0xf3] = '\0';
  puVar11[0xf4] = '\0';
  puVar11[0xf5] = '\0';
  puVar11[0xf6] = '\0';
  puVar11[0xf7] = '\0';
  puVar11[0xf8] = '\0';
  puVar11[0xf9] = '\0';
  puVar11[0xfa] = '\0';
  puVar11[0xfb] = '\0';
  puVar11[0xfc] = '\0';
  puVar11[0xfd] = '\0';
  puVar11[0xfe] = '\0';
  puVar11[0xff] = '\0';
  puVar11[0x80] = '\0';
  puVar11[0x81] = '\0';
  puVar11[0x82] = '\0';
  puVar11[0x83] = '\0';
  puVar11[0x84] = '\0';
  puVar11[0x85] = '\0';
  puVar11[0x86] = '\0';
  puVar11[0x87] = '\0';
  puVar11[0x88] = '\0';
  puVar11[0x89] = '\0';
  puVar11[0x8a] = '\0';
  puVar11[0x8b] = '\0';
  puVar11[0x8c] = '\0';
  puVar11[0x8d] = '\0';
  puVar11[0x8e] = '\0';
  puVar11[0x8f] = '\0';
  puVar11[0x90] = '\0';
  puVar11[0x91] = '\0';
  puVar11[0x92] = '\0';
  puVar11[0x93] = '\0';
  puVar11[0x94] = '\0';
  puVar11[0x95] = '\0';
  puVar11[0x96] = '\0';
  puVar11[0x97] = '\0';
  puVar11[0x98] = '\0';
  puVar11[0x99] = '\0';
  puVar11[0x9a] = '\0';
  puVar11[0x9b] = '\0';
  puVar11[0x9c] = '\0';
  puVar11[0x9d] = '\0';
  puVar11[0x9e] = '\0';
  puVar11[0x9f] = '\0';
  puVar11[0xa0] = '\0';
  puVar11[0xa1] = '\0';
  puVar11[0xa2] = '\0';
  puVar11[0xa3] = '\0';
  puVar11[0xa4] = '\0';
  puVar11[0xa5] = '\0';
  puVar11[0xa6] = '\0';
  puVar11[0xa7] = '\0';
  puVar11[0xa8] = '\0';
  puVar11[0xa9] = '\0';
  puVar11[0xaa] = '\0';
  puVar11[0xab] = '\0';
  puVar11[0xac] = '\0';
  puVar11[0xad] = '\0';
  puVar11[0xae] = '\0';
  puVar11[0xaf] = '\0';
  puVar11[0xb0] = '\0';
  puVar11[0xb1] = '\0';
  puVar11[0xb2] = '\0';
  puVar11[0xb3] = '\0';
  puVar11[0xb4] = '\0';
  puVar11[0xb5] = '\0';
  puVar11[0xb6] = '\0';
  puVar11[0xb7] = '\0';
  puVar11[0xb8] = '\0';
  puVar11[0xb9] = '\0';
  puVar11[0xba] = '\0';
  puVar11[0xbb] = '\0';
  puVar11[0xbc] = '\0';
  puVar11[0xbd] = '\0';
  puVar11[0xbe] = '\0';
  puVar11[0xbf] = '\0';
  puVar11[0x40] = '\0';
  puVar11[0x41] = '\0';
  puVar11[0x42] = '\0';
  puVar11[0x43] = '\0';
  puVar11[0x44] = '\0';
  puVar11[0x45] = '\0';
  puVar11[0x46] = '\0';
  puVar11[0x47] = '\0';
  puVar11[0x48] = '\0';
  puVar11[0x49] = '\0';
  puVar11[0x4a] = '\0';
  puVar11[0x4b] = '\0';
  puVar11[0x4c] = '\0';
  puVar11[0x4d] = '\0';
  puVar11[0x4e] = '\0';
  puVar11[0x4f] = '\0';
  puVar11[0x50] = '\0';
  puVar11[0x51] = '\0';
  puVar11[0x52] = '\0';
  puVar11[0x53] = '\0';
  puVar11[0x54] = '\0';
  puVar11[0x55] = '\0';
  puVar11[0x56] = '\0';
  puVar11[0x57] = '\0';
  puVar11[0x58] = '\0';
  puVar11[0x59] = '\0';
  puVar11[0x5a] = '\0';
  puVar11[0x5b] = '\0';
  puVar11[0x5c] = '\0';
  puVar11[0x5d] = '\0';
  puVar11[0x5e] = '\0';
  puVar11[0x5f] = '\0';
  puVar11[0x60] = '\0';
  puVar11[0x61] = '\0';
  puVar11[0x62] = '\0';
  puVar11[99] = '\0';
  puVar11[100] = '\0';
  puVar11[0x65] = '\0';
  puVar11[0x66] = '\0';
  puVar11[0x67] = '\0';
  puVar11[0x68] = '\0';
  puVar11[0x69] = '\0';
  puVar11[0x6a] = '\0';
  puVar11[0x6b] = '\0';
  puVar11[0x6c] = '\0';
  puVar11[0x6d] = '\0';
  puVar11[0x6e] = '\0';
  puVar11[0x6f] = '\0';
  puVar11[0x70] = '\0';
  puVar11[0x71] = '\0';
  puVar11[0x72] = '\0';
  puVar11[0x73] = '\0';
  puVar11[0x74] = '\0';
  puVar11[0x75] = '\0';
  puVar11[0x76] = '\0';
  puVar11[0x77] = '\0';
  puVar11[0x78] = '\0';
  puVar11[0x79] = '\0';
  puVar11[0x7a] = '\0';
  puVar11[0x7b] = '\0';
  puVar11[0x7c] = '\0';
  puVar11[0x7d] = '\0';
  puVar11[0x7e] = '\0';
  puVar11[0x7f] = '\0';
  puVar11[0] = '\0';
  puVar11[1] = '\0';
  puVar11[2] = '\0';
  puVar11[3] = '\0';
  puVar11[4] = '\0';
  puVar11[5] = '\0';
  puVar11[6] = '\0';
  puVar11[7] = '\0';
  puVar11[8] = '\0';
  puVar11[9] = '\0';
  puVar11[10] = '\0';
  puVar11[0xb] = '\0';
  puVar11[0xc] = '\0';
  puVar11[0xd] = '\0';
  puVar11[0xe] = '\0';
  puVar11[0xf] = '\0';
  puVar11[0x10] = '\0';
  puVar11[0x11] = '\0';
  puVar11[0x12] = '\0';
  puVar11[0x13] = '\0';
  puVar11[0x14] = '\0';
  puVar11[0x15] = '\0';
  puVar11[0x16] = '\0';
  puVar11[0x17] = '\0';
  puVar11[0x18] = '\0';
  puVar11[0x19] = '\0';
  puVar11[0x1a] = '\0';
  puVar11[0x1b] = '\0';
  puVar11[0x1c] = '\0';
  puVar11[0x1d] = '\0';
  puVar11[0x1e] = '\0';
  puVar11[0x1f] = '\0';
  puVar11[0x20] = '\0';
  puVar11[0x21] = '\0';
  puVar11[0x22] = '\0';
  puVar11[0x23] = '\0';
  puVar11[0x24] = '\0';
  puVar11[0x25] = '\0';
  puVar11[0x26] = '\0';
  puVar11[0x27] = '\0';
  puVar11[0x28] = '\0';
  puVar11[0x29] = '\0';
  puVar11[0x2a] = '\0';
  puVar11[0x2b] = '\0';
  puVar11[0x2c] = '\0';
  puVar11[0x2d] = '\0';
  puVar11[0x2e] = '\0';
  puVar11[0x2f] = '\0';
  puVar11[0x30] = '\0';
  puVar11[0x31] = '\0';
  puVar11[0x32] = '\0';
  puVar11[0x33] = '\0';
  puVar11[0x34] = '\0';
  puVar11[0x35] = '\0';
  puVar11[0x36] = '\0';
  puVar11[0x37] = '\0';
  puVar11[0x38] = '\0';
  puVar11[0x39] = '\0';
  puVar11[0x3a] = '\0';
  puVar11[0x3b] = '\0';
  puVar11[0x3c] = '\0';
  puVar11[0x3d] = '\0';
  puVar11[0x3e] = '\0';
  puVar11[0x3f] = '\0';
  puVar22 = (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar11;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar11 + 0x100;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar11 + 0x100;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22);
  }
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_c8[0] = false;
  auVar25 = ZEXT1664(auVar29);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_60,0x100,(bool *)local_c8,(allocator_type *)local_f8);
  local_38 = sample_rate;
  if (this->n != 0) {
    puVar22 = (uchar *)0x0;
    lVar12 = 0;
    do {
      if ((uchar *)BWT->_M_string_length <= puVar22) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar22);
        goto LAB_00104a41;
      }
      if ((ulong)puVar22[(long)(BWT->_M_dataplus)._M_p] == 0) {
        this->terminator_position = (ulint)puVar22;
        lVar12 = lVar12 + 1;
      }
      else {
        rVar30 = std::vector<bool,_std::allocator<bool>_>::at
                           (&local_60,(ulong)puVar22[(long)(BWT->_M_dataplus)._M_p]);
        if ((*rVar30._M_p & rVar30._M_mask) == 0) {
          if ((uchar *)BWT->_M_string_length <= puVar22) goto LAB_00104a6e;
          local_c8[0] = puVar22[(long)(BWT->_M_dataplus)._M_p];
          if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_118,
                       (iterator)
                       local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,local_c8);
          }
          else {
            *local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_c8[0];
            local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if ((uchar *)BWT->_M_string_length <= puVar22) goto LAB_00104a7f;
          rVar30 = std::vector<bool,_std::allocator<bool>_>::at
                             (&local_60,(ulong)puVar22[(long)(BWT->_M_dataplus)._M_p]);
          *rVar30._M_p = *rVar30._M_p | rVar30._M_mask;
        }
      }
      puVar6 = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar11 = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar22 = puVar22 + 1;
    } while (puVar22 < (uchar *)this->n);
    if (lVar12 == 1) {
      lVar12 = (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      this->sigma = (uint)lVar12;
      if (lVar12 != 0) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar12) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar11,puVar6);
      }
      if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar19 = 0;
        do {
          (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start
          [local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar19]] = (uchar)uVar19;
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (uVar19 < (ulong)((long)local_118.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_118.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
                 (ulong)this->sigma,(allocator_type *)local_f8);
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
      puVar22 = (this->inverse_remapping).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT71(local_c8._1_7_,local_c8[0]);
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
      local_c8[0] = false;
      local_c8._1_7_ = 0;
      local_c8._8_8_ = (pointer)0x0;
      local_c8._16_8_ = (pointer)0x0;
      if (puVar22 != (pointer)0x0) {
        operator_delete(puVar22);
      }
      if ((void *)CONCAT71(local_c8._1_7_,local_c8[0]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_c8._1_7_,local_c8[0]));
      }
      puVar22 = puVar11;
      if (this->sigma != 0) {
        uVar19 = 0;
        do {
          if ((ulong)((long)local_118.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_118.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) <= uVar19) goto LAB_00104a41;
          (this->inverse_remapping).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] =
               local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
          uVar19 = uVar19 + 1;
        } while ((uint)uVar19 < this->sigma);
      }
      if (this->n != 0) {
        uVar19 = 0;
        do {
          if (BWT->_M_string_length <= uVar19) goto LAB_00104a4f;
          pcVar1 = (BWT->_M_dataplus)._M_p;
          pcVar1[uVar19] =
               (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start[(byte)pcVar1[uVar19]];
          uVar19 = uVar19 + 1;
        } while (uVar19 < this->n);
      }
      WaveletTree::WaveletTree((WaveletTree *)local_c8,BWT,verbose);
      (this->bwt_wt).n = CONCAT71(local_c8._1_7_,local_c8[0]);
      puVar22 = (uchar *)0x0;
      local_f8._0_8_ =
           (this->bwt_wt).nodes.
           super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_f8._8_8_ =
           (this->bwt_wt).nodes.
           super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_e8 = (this->bwt_wt).nodes.
                 super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->bwt_wt).nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._8_8_;
      (this->bwt_wt).nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._16_8_;
      (this->bwt_wt).nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._24_8_;
      local_c8._8_8_ = (pointer)0x0;
      local_c8._16_8_ = (pointer)0x0;
      local_c8._24_8_ = (pointer)0x0;
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 local_f8);
      auVar28 = stack0xffffffffffffff58;
      (this->bwt_wt).sigma = local_c8._32_4_;
      (this->bwt_wt).log_sigma = local_c8._36_4_;
      (this->bwt_wt).number_of_nodes = (ulint)puStack_a0;
      unique0x100034a0 = auVar28;
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 (local_c8 + 8));
      (this->marked_positions).n = 0;
      puVar2 = (this->marked_positions).bitvector.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->marked_positions).bitvector.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->marked_positions).bitvector.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->marked_positions).bitvector.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (this->marked_positions).rank_ptrs_1.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->marked_positions).rank_ptrs_1.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->marked_positions).rank_ptrs_1.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->marked_positions).rank_ptrs_1.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar3 = (this->marked_positions).rank_ptrs_2.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->marked_positions).rank_ptrs_2.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->marked_positions).rank_ptrs_2.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->marked_positions).rank_ptrs_2.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      (this->marked_positions).local_rank1 = 0;
      (this->marked_positions).global_rank1 = 0;
      bv::internal::packed_view<std::vector>::packed_view
                ((packed_view<std::vector> *)local_c8,(ulong)this->w,this->number_of_SA_pointers);
      (this->text_pointers)._bits._container.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
      puVar2 = (this->text_pointers)._bits._container.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->text_pointers)._bits._container.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT71(local_c8._1_7_,local_c8[0]);
      (this->text_pointers)._bits._container.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
      local_c8[0] = false;
      local_c8._1_7_ = 0;
      local_c8._8_8_ = SUB168(ZEXT816(0),4);
      local_c8._16_8_ = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      (this->text_pointers)._field_mask = (word_type)puStack_a0;
      (this->text_pointers)._size = local_c8._24_8_;
      (this->text_pointers)._width = local_c8._32_8_;
      if ((void *)CONCAT71(local_c8._1_7_,local_c8[0]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_c8._1_7_,local_c8[0]));
      }
      this->log_sigma = (this->bwt_wt).log_sigma;
      __s = (pointer)operator_new(0x800);
      local_100 = (uint)verbose;
      memset(__s,0,0x800);
      puVar2 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = __s;
      (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __s + 0x100;
      (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __s + 0x100;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2[0xff] = 0;
      if (this->n != 0) {
        local_fc = (this->bwt_wt).log_sigma;
        psVar4 = (this->bwt_wt).nodes.
                 super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar22 = (uchar *)0x0;
        do {
          if (puVar22 != (uchar *)this->terminator_position) {
            if (local_fc == 0) {
              uVar19 = 0;
            }
            else {
              lVar12 = 0;
              uVar19 = 0;
              puVar17 = puVar22;
              uVar20 = local_fc;
              do {
                uVar18 = (ulong)puVar17 >> 6;
                uVar5 = *(ulong *)(*(long *)&psVar4[lVar12].bitvector.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + uVar18 * 8);
                bVar21 = (byte)puVar17 & 0x3f;
                if ((uVar5 >> (bVar21 ^ 0x3f) & 1) == 0) {
                  if ((uchar *)psVar4[lVar12].n == puVar17) {
                    uVar14 = psVar4[lVar12].global_rank1;
                  }
                  else {
                    lVar13 = POPCOUNT(uVar5 >> ((ulong)(byte)-bVar21 & 0x3f));
                    if (((ulong)puVar17 & 0x3f) == 0) {
                      lVar13 = 0;
                    }
                    uVar14 = lVar13 + *(long *)(*(long *)&psVar4[lVar12].rank_ptrs_1.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data +
                                               ((ulong)puVar17 >> 0xc) * 8) +
                             (ulong)*(ushort *)
                                     (*(long *)&psVar4[lVar12].rank_ptrs_2.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data + uVar18 * 2);
                  }
                  puVar17 = puVar17 + -uVar14;
                  lVar12 = lVar12 * 2 + 1;
                }
                else {
                  if ((uchar *)psVar4[lVar12].n == puVar17) {
                    puVar17 = (uchar *)psVar4[lVar12].global_rank1;
                  }
                  else {
                    lVar13 = POPCOUNT(uVar5 >> ((ulong)(byte)-bVar21 & 0x3f));
                    if (((ulong)puVar17 & 0x3f) == 0) {
                      lVar13 = 0;
                    }
                    puVar17 = (uchar *)(lVar13 + *(long *)(*(long *)&psVar4[lVar12].rank_ptrs_1.
                                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                  ((ulong)puVar17 >> 0xc) * 8) +
                                       (ulong)*(ushort *)
                                               (*(long *)&psVar4[lVar12].rank_ptrs_2.
                                                                                                                    
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data + uVar18 * 2));
                  }
                  lVar12 = lVar12 * 2 + 2;
                }
                uVar19 = (ulong)(((uint)(uVar5 >> (bVar21 ^ 0x3f)) & 1) + (uint)(byte)uVar19 * 2);
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
              uVar19 = uVar19 & 0xff;
            }
            puVar2[uVar19] = puVar2[uVar19] + 1;
          }
          puVar22 = puVar22 + 1;
        } while (puVar22 < (uchar *)this->n);
      }
      uVar15 = *puVar2;
      lVar12 = 1;
      do {
        uVar15 = uVar15 + puVar2[lVar12];
        puVar2[lVar12] = uVar15;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0xff);
      memmove(puVar2 + 1,puVar2,0x7f0);
      uVar7 = local_100;
      *puVar2 = 0;
      lVar12 = 0;
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f(ZEXT816(0xff));
      auVar25 = vpternlogd_avx512f(auVar25,auVar25,auVar25,0xff);
      do {
        auVar26 = vpbroadcastq_avx512f();
        auVar26 = vporq_avx512f(auVar26,auVar23);
        uVar19 = vpcmpuq_avx512f(auVar26,auVar24,1);
        auVar26 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar2 + lVar12));
        auVar27._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar26._8_8_;
        auVar27._0_8_ = (ulong)((byte)uVar19 & 1) * auVar26._0_8_;
        auVar27._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar26._16_8_;
        auVar27._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar26._24_8_;
        auVar27._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar26._32_8_;
        auVar27._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar26._40_8_;
        auVar27._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar26._48_8_;
        auVar27._56_8_ = (uVar19 >> 7) * auVar26._56_8_;
        auVar26 = vpsubq_avx512f(auVar27,auVar25);
        auVar26 = vmovdqu64_avx512f(auVar26);
        *(undefined1 (*) [64])(puVar2 + lVar12) = auVar26;
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x100);
      if (this->n != 0) {
        uVar19 = 0;
        do {
          if (BWT->_M_string_length <= uVar19) goto LAB_00104a5d;
          pcVar1 = (BWT->_M_dataplus)._M_p;
          pcVar1[uVar19] =
               (this->inverse_remapping).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[(byte)pcVar1[uVar19]];
          uVar19 = uVar19 + 1;
        } while (uVar19 < this->n);
      }
      if (this->terminator_position < BWT->_M_string_length) {
        (BWT->_M_dataplus)._M_p[this->terminator_position] = '\0';
        if (local_38 != 0) {
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n  Marking positions containing a SA pointer ... ",
                       0x31);
          }
          markPositions((vector<bool,_std::allocator<bool>_> *)local_f8,this,SUB41(uVar7,0));
          succinct_bitvector::succinct_bitvector
                    ((succinct_bitvector *)local_c8,(vector<bool,_std::allocator<bool>_> *)local_f8)
          ;
          (this->marked_positions).n = CONCAT71(local_c8._1_7_,local_c8[0]);
          (this->marked_positions).bitvector.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._24_8_;
          puVar2 = (this->marked_positions).bitvector.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (this->marked_positions).bitvector.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_c8._8_8_;
          (this->marked_positions).bitvector.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_c8._16_8_;
          local_c8._8_8_ = (pointer)0x0;
          local_c8._16_8_ = (pointer)0x0;
          local_c8._24_8_ = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          (this->marked_positions).rank_ptrs_1.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_98;
          puVar2 = (this->marked_positions).rank_ptrs_1.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (this->marked_positions).rank_ptrs_1.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_c8._32_8_;
          (this->marked_positions).rank_ptrs_1.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puStack_a0;
          stack0xffffffffffffff58 = (undefined1  [16])0x0;
          local_98 = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          (this->marked_positions).rank_ptrs_2.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_80;
          puVar3 = (this->marked_positions).rank_ptrs_2.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (this->marked_positions).rank_ptrs_2.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_90._0_8_;
          (this->marked_positions).rank_ptrs_2.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_90._8_8_;
          local_90 = (undefined1  [16])0x0;
          local_80 = (pointer)0x0;
          if (puVar3 != (pointer)0x0) {
            operator_delete(puVar3);
          }
          (this->marked_positions).local_rank1 = local_70;
          (this->marked_positions).global_rank1 = local_78;
          if ((pointer)local_90._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_90._0_8_);
          }
          if ((pointer)local_c8._32_8_ != (pointer)0x0) {
            operator_delete((void *)local_c8._32_8_);
          }
          if ((pointer)local_c8._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_c8._8_8_);
          }
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Done.\n",8);
            if (verbose) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\n  Sampling SA pointers ... ",0x1c);
            }
          }
          sampleSA(this,SUB41(uVar7,0));
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Done.\n",8);
          }
          if ((pointer)local_f8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_f8._0_8_);
            local_f8._0_8_ = (pointer)0x0;
            local_f8._8_8_ = local_f8._8_8_ & 0xffffffff00000000;
            local_e8 = (pointer)0x0;
            local_e0 = 0;
            local_d8 = (_Bit_pointer)0x0;
          }
        }
        if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return;
      }
      uVar16 = std::__throw_out_of_range_fmt
                         ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      if ((pointer)local_f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_f8._0_8_);
        local_f8._0_8_ = (pointer)0x0;
        local_f8._8_8_ = local_f8._8_8_ & 0xffffffff00000000;
        local_e8 = (pointer)0x0;
        local_e0 = 0;
        local_d8 = (_Bit_pointer)0x0;
      }
      if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      puVar22 = (this->inverse_remapping).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (puVar22 != (pointer)0x0) {
        operator_delete(puVar22);
      }
      puVar22 = (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (puVar22 != (pointer)0x0) {
        operator_delete(puVar22);
      }
      puVar2 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (this->text_pointers)._bits._container.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      succinct_bitvector::~succinct_bitvector(&this->marked_positions);
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
                (&(this->bwt_wt).nodes);
      _Unwind_Resume(uVar16);
    }
  }
LAB_00104a90:
  std::operator<<((ostream *)&std::cout,
                  "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n");
  exit(1);
LAB_00104a41:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104a4f:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104a5d:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00104a6e:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar22);
LAB_00104a7f:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar22);
  goto LAB_00104a90;
}

Assistant:

IndexedBWT(string &BWT, ulint sample_rate, bool verbose=false){

		this->n=BWT.length();
		this->offrate=sample_rate;

		number_of_SA_pointers = (sample_rate==0?0:n/sample_rate + 1);

		if(verbose) cout << " Building indexed BWT data structure" << endl;
		if(verbose) cout << "  Number of sampled SA pointers = " << number_of_SA_pointers << endl;

		w = ceil(log2(n));
		if(w<1) w=1;

		ulint nr_of_terminators=0;

		//compute re-mapping to keep alphabet size to a minimum
		//from text chars -> to integers in {0,...,sigma}. the 0x0 byte is also remapped in 0x0, as the first alphabet character.
		remapping = vector<uchar>(256,0);

		//detect alphabet
		vector<uchar> alphabet;
		vector<bool> char_inserted = vector<bool>(256,false);

		for(ulint i=0;i<n;i++){

			if((uchar)BWT.at(i)==0){//found terminator. Save position
				terminator_position = i;
				nr_of_terminators++;
			}else{

				if(not char_inserted.at((uchar)BWT.at(i))){

					alphabet.push_back((uchar)BWT.at(i));
					char_inserted.at((uchar)BWT.at(i))=true;

				}

			}
		}

		if(nr_of_terminators!=1){

			cout << "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n";
			exit(1);

		}

		sigma = alphabet.size();

		//sort alphabet

		std::sort(alphabet.begin(),alphabet.end());

		//calculate remapping
		//note: remapping of terminator (0x0) is 0

		for(uint i=0;i<alphabet.size();i++)
			remapping[alphabet.at(i)] = i;

		//calculate inverse remapping

		inverse_remapping = vector<uchar>(sigma);

		for(uint i=0;i<sigma;i++)
			inverse_remapping[i] = alphabet.at(i);

		//apply remapping

		for(ulint i=0;i<n;i++)
			BWT.at(i) = remapping[(uchar)BWT.at(i)];

		bwt_wt =  WaveletTree(BWT,verbose);

		marked_positions =  succinct_bitvector();

		text_pointers =  packed_view_t(w,number_of_SA_pointers);

		log_sigma = bwt_wt.bitsPerSymbol();

		FIRST = vector<ulint>(256,0);

		FIRST[TERMINATOR]=0;//first occurrence of terminator char in the first column is at the beginning

		//count number of occurrences of each character
		for(ulint i=0;i<n;i++)
			if(i!=terminator_position)
				FIRST[bwt_wt.charAt(i)]++;

		for(uint i=1;i<255;i++)
			FIRST[i] += FIRST[i-1];

		for(int i=254;i>0;i--)
			FIRST[i] = FIRST[i-1];

		FIRST[0] = 0;

		for(uint i=0;i<255;i++)
			FIRST[i]++;

		//restore original values in BWT
		for(ulint i=0;i<n;i++)
			BWT.at(i) = inverse_remapping[(uchar)BWT.at(i)];

		BWT.at(terminator_position) = 0;

		if(sample_rate>0){
			if(verbose) cout << "\n  Marking positions containing a SA pointer ... ";

			vector<bool> mark_pos = markPositions(verbose);
			marked_positions = succinct_bitvector( mark_pos );

			if(verbose) cout << "  Done.\n";

			if(verbose) cout << "\n  Sampling SA pointers ... ";
			sampleSA(verbose);
			if(verbose) cout << "  Done.\n";
		}

	}